

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

void __thiscall
CVmDynamicFunc::load_image_data(CVmDynamicFunc *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  ushort uVar1;
  vm_dynfunc_ext *val;
  ulong uVar2;
  ulong bytecode_len;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  bytecode_len = (ulong)*(ushort *)ptr;
  uVar1 = *(ushort *)(ptr + 2);
  val = vm_dynfunc_ext::alloc_ext(this,bytecode_len,(uint)uVar1);
  (this->super_CVmObject).ext_ = (char *)val;
  vmb_get_dh(ptr + 4,&val->method_ctx);
  vmb_get_dh(ptr + 9,&val->src);
  val->obj_refs[val->obj_ref_cnt] = self;
  memcpy(val[1].obj_refs + (long)val->obj_ref_cnt + -0xb,ptr + 0xe,bytecode_len);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    val->obj_refs[uVar2] = (uint)*(ushort *)(ptr + uVar2 * 2 + bytecode_len + 0xe);
  }
  return;
}

Assistant:

void CVmDynamicFunc::load_image_data(VMG_ vm_obj_id_t self,
                                     const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the bytecode length */
    size_t bytecode_len = osrp2(ptr);
    ptr += 2;

    /* read the object reference count */
    int obj_ref_cnt = osrp2(ptr);
    ptr += 2;

    /* allocate the extension */
    vm_dynfunc_ext *ext = vm_dynfunc_ext::alloc_ext(
        vmg_ this, bytecode_len, obj_ref_cnt);
    ext_ = (char *)ext;

    /* save the method context object */
    vmb_get_dh(ptr, &ext->method_ctx);
    ptr += VMB_DATAHOLDER;

    /* save the source string value */
    vmb_get_dh(ptr, &ext->src);
    ptr += VMB_DATAHOLDER;

    /* set up the dynamic code prefix header */
    vmb_put_objid(ext->get_prefix_ptr(), self);

    /* copy the byte code */
    memcpy(ext->get_bytecode_ptr(), ptr, bytecode_len);
    ptr += bytecode_len;

    /* load the object reference offsets */
    for (int i = 0 ; i < obj_ref_cnt ; ++i, ptr += 2)
        ext->obj_refs[i] = osrp2(ptr);
}